

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3_result_error_nomem(sqlite3_context *pCtx)

{
  Mem *p;
  
  p = pCtx->pOut;
  if ((p->flags & 0x9000) == 0) {
    p->flags = 1;
  }
  else {
    vdbeMemClearExternAndSetNull(p);
    p = pCtx->pOut;
  }
  pCtx->isError = 7;
  sqlite3OomFault(p->db);
  return;
}

Assistant:

SQLITE_API void sqlite3_result_error_nomem(sqlite3_context *pCtx){
  assert( sqlite3_mutex_held(pCtx->pOut->db->mutex) );
  sqlite3VdbeMemSetNull(pCtx->pOut);
  pCtx->isError = SQLITE_NOMEM_BKPT;
  sqlite3OomFault(pCtx->pOut->db);
}